

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O1

void al_set_new_bitmap_format(int format)

{
  long *plVar1;
  
  plVar1 = (long *)__tls_get_addr(&PTR_001d9500);
  if (*plVar1 == 0) {
    *plVar1 = (long)(plVar1 + 1);
    initialize_tls_values((thread_local_state *)(plVar1 + 1));
  }
  if (*plVar1 != 0) {
    *(int *)(*plVar1 + 0x108) = format;
  }
  return;
}

Assistant:

void al_set_new_bitmap_format(int format)
{
   thread_local_state *tls;

   if ((tls = tls_get()) == NULL)
      return;
   tls->new_bitmap_format = format;
}